

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void pobr::utils::Logger::error(string *message,bool *noThrow)

{
  Exception *this;
  allocator local_99;
  string local_98;
  uint local_78;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  bool *local_18;
  bool *noThrow_local;
  string *message_local;
  
  local_18 = noThrow;
  noThrow_local = (bool *)message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"Error",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"red",&local_71);
  TerminalPrinter::printLabel(&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"Error",&local_99);
  local_78 = TerminalPrinter::getLabelLength(&local_98);
  print(&local_78,(string *)noThrow_local);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if ((*local_18 & 1U) != 0) {
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x28);
  Exception::Exception(this,(string *)noThrow_local);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Logger::error(const std::string& message, const bool& noThrow)
{
    Logger::printLabel("Error", "red");
    Logger::print(Logger::getLabelLength("Error"), message);

    if (noThrow)
    {
        return;
    }

    throw Logger::Exception(message);
}